

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O3

int ssl_parse_encrypted_pms(mbedtls_ssl_context *ssl,uchar *p,uchar *end,size_t pms_offset)

{
  mbedtls_ssl_handshake_params *pmVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  mbedtls_ssl_key_cert *pmVar5;
  mbedtls_ssl_config *pmVar6;
  byte *pbVar7;
  mbedtls_pk_context *pmVar8;
  ulong uVar9;
  uchar ver [2];
  size_t peer_pmslen;
  uchar peer_pms [48];
  uchar fake_pms [48];
  byte local_aa;
  byte local_a9;
  size_t local_a8;
  uint local_a0 [2];
  byte local_98;
  byte local_97;
  byte local_68 [56];
  
  if (((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
      (pmVar5 = ssl->handshake->key_cert, pmVar5 == (mbedtls_ssl_key_cert *)0x0)) &&
     (pmVar5 = ssl->conf->key_cert, pmVar5 == (mbedtls_ssl_key_cert *)0x0)) {
    pmVar8 = (mbedtls_pk_context *)0x0;
  }
  else {
    pmVar8 = pmVar5->key;
  }
  sVar4 = mbedtls_pk_get_bitlen(pmVar8);
  pmVar1 = ssl->handshake;
  if (((pmVar1 == (mbedtls_ssl_handshake_params *)0x0) ||
      (pmVar5 = pmVar1->key_cert, pmVar5 == (mbedtls_ssl_key_cert *)0x0)) &&
     (pmVar5 = ssl->conf->key_cert, pmVar5 == (mbedtls_ssl_key_cert *)0x0)) {
    pmVar8 = (mbedtls_pk_context *)0x0;
  }
  else {
    pmVar8 = pmVar5->key;
  }
  iVar2 = mbedtls_pk_can_do(pmVar8,MBEDTLS_PK_RSA);
  if (iVar2 == 0) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xc34,"got no RSA private key");
    return -0x7600;
  }
  uVar9 = sVar4 + 7 >> 3;
  local_a8 = pms_offset;
  if (ssl->minor_ver != 0) {
    if ((*p != (uchar)(sVar4 + 7 >> 0xb)) || (p[1] != (uchar)uVar9)) {
      iVar2 = 0xc42;
      goto LAB_0012194c;
    }
    p = p + 2;
  }
  if (p + uVar9 != end) {
    iVar2 = 0xc4a;
LAB_0012194c:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,iVar2,"bad client key exchange message");
    return -0x7c00;
  }
  mbedtls_ssl_write_version
            (ssl->handshake->max_major_ver,ssl->handshake->max_minor_ver,
             *(uint *)&ssl->conf->field_0x174 >> 1 & 1,&local_aa);
  iVar2 = (*ssl->conf->f_rng)(ssl->conf->p_rng,local_68,0x30);
  sVar4 = local_a8;
  if (iVar2 != 0) {
    return iVar2;
  }
  if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
     (pmVar5 = ssl->handshake->key_cert, pmVar5 == (mbedtls_ssl_key_cert *)0x0)) {
    pmVar6 = ssl->conf;
    pmVar5 = pmVar6->key_cert;
    if (pmVar5 == (mbedtls_ssl_key_cert *)0x0) {
      pmVar8 = (mbedtls_pk_context *)0x0;
      goto LAB_001219de;
    }
  }
  else {
    pmVar6 = ssl->conf;
  }
  pmVar8 = pmVar5->key;
LAB_001219de:
  uVar3 = mbedtls_pk_decrypt(pmVar8,p,uVar9,&local_98,(size_t *)local_a0,0x30,
                             (_func_int_void_ptr_uchar_ptr_size_t *)pmVar6->f_rng,pmVar6->p_rng);
  ssl->handshake->pmslen = 0x30;
  uVar3 = local_a0[0] ^ 0x30 | uVar3;
  uVar9 = 0;
  do {
    pbVar7 = &local_98;
    if ((int)(-((byte)(local_aa ^ local_98 | local_a9 ^ local_97) | uVar3) | uVar3) < 0) {
      pbVar7 = local_68;
    }
    pmVar1->premaster[uVar9 + sVar4] = pbVar7[uVar9];
    uVar9 = uVar9 + 1;
  } while (uVar9 < ssl->handshake->pmslen);
  return 0;
}

Assistant:

static int ssl_parse_encrypted_pms( mbedtls_ssl_context *ssl,
                                    const unsigned char *p,
                                    const unsigned char *end,
                                    size_t pms_offset )
{
    int ret;
    size_t len = mbedtls_pk_get_len( mbedtls_ssl_own_key( ssl ) );
    unsigned char *pms = ssl->handshake->premaster + pms_offset;
    unsigned char ver[2];
    unsigned char fake_pms[48], peer_pms[48];
    unsigned char mask;
    size_t i, peer_pmslen;
    unsigned int diff;

    if( ! mbedtls_pk_can_do( mbedtls_ssl_own_key( ssl ), MBEDTLS_PK_RSA ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "got no RSA private key" ) );
        return( MBEDTLS_ERR_SSL_PRIVATE_KEY_REQUIRED );
    }

    /*
     * Decrypt the premaster using own private RSA key
     */
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( ssl->minor_ver != MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        if( *p++ != ( ( len >> 8 ) & 0xFF ) ||
            *p++ != ( ( len      ) & 0xFF ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
        }
    }
#endif

    if( p + len != end )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
    }

    mbedtls_ssl_write_version( ssl->handshake->max_major_ver,
                       ssl->handshake->max_minor_ver,
                       ssl->conf->transport, ver );

    /*
     * Protection against Bleichenbacher's attack: invalid PKCS#1 v1.5 padding
     * must not cause the connection to end immediately; instead, send a
     * bad_record_mac later in the handshake.
     * Also, avoid data-dependant branches here to protect against
     * timing-based variants.
     */
    ret = ssl->conf->f_rng( ssl->conf->p_rng, fake_pms, sizeof( fake_pms ) );
    if( ret != 0 )
        return( ret );

    ret = mbedtls_pk_decrypt( mbedtls_ssl_own_key( ssl ), p, len,
                      peer_pms, &peer_pmslen,
                      sizeof( peer_pms ),
                      ssl->conf->f_rng, ssl->conf->p_rng );

    diff  = (unsigned int) ret;
    diff |= peer_pmslen ^ 48;
    diff |= peer_pms[0] ^ ver[0];
    diff |= peer_pms[1] ^ ver[1];

#if defined(MBEDTLS_SSL_DEBUG_ALL)
    if( diff != 0 )
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange message" ) );
#endif

    if( sizeof( ssl->handshake->premaster ) < pms_offset ||
        sizeof( ssl->handshake->premaster ) - pms_offset < 48 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }
    ssl->handshake->pmslen = 48;

    /* mask = diff ? 0xff : 0x00 using bit operations to avoid branches */
    /* MSVC has a warning about unary minus on unsigned, but this is
     * well-defined and precisely what we want to do here */
#if defined(_MSC_VER)
#pragma warning( push )
#pragma warning( disable : 4146 )
#endif
    mask = - ( ( diff | - diff ) >> ( sizeof( unsigned int ) * 8 - 1 ) );
#if defined(_MSC_VER)
#pragma warning( pop )
#endif

    for( i = 0; i < ssl->handshake->pmslen; i++ )
        pms[i] = ( mask & fake_pms[i] ) | ( (~mask) & peer_pms[i] );

    return( 0 );
}